

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall
kj::(anonymous_namespace)::expectResImpl<kj::Array<char16_t>,char16_t>
          (_anonymous_namespace_ *this,EncodingResult<kj::Array<char16_t>_> *result,
          ArrayPtr<const_char16_t> expected,bool errors)

{
  char16_t i_00;
  char16_t *pcVar1;
  char16_t *pcVar2;
  CappedArray<char,_5UL> CVar3;
  unsigned_long i;
  CappedArray<char,_5UL> local_50;
  CappedArray<char,_5UL> local_40;
  
  pcVar1 = expected.ptr;
  if ((int)expected.size_ == 0) {
    if (((byte)this[0x18] & _::Debug::minSeverity < 3) == 1) {
      _::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x2d,ERROR,"\"failed: expected \" \"!result.hadErrors\"",
                 (char (*) [35])"failed: expected !result.hadErrors");
    }
  }
  else if (this[0x18] == (_anonymous_namespace_)0x0 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[34]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x2b,ERROR,"\"failed: expected \" \"result.hadErrors\"",
               (char (*) [34])"failed: expected result.hadErrors");
  }
  pcVar2 = *(char16_t **)(this + 8);
  if ((pcVar2 != pcVar1) && (_::Debug::minSeverity < 3)) {
    local_50.currentSize = (size_t)pcVar1;
    local_40.currentSize = (size_t)pcVar2;
    _::Debug::log<char_const(&)[50],unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x30,ERROR,
               "\"failed: expected \" \"result.size() == expected.size()\", result.size(), expected.size()"
               ,(char (*) [50])"failed: expected result.size() == expected.size()",
               &local_40.currentSize,&local_50.currentSize);
    pcVar2 = *(char16_t **)(this + 8);
  }
  if (pcVar2 < pcVar1) {
    pcVar1 = pcVar2;
  }
  for (pcVar2 = (char16_t *)0x0; pcVar1 != pcVar2; pcVar2 = (char16_t *)((long)pcVar2 + 1)) {
    i_00 = *(char16_t *)(*(long *)this + (long)pcVar2 * 2);
    if ((i_00 != *(char16_t *)((long)&(result->super_Array<char16_t>).ptr + (long)pcVar2 * 2)) &&
       (_::Debug::minSeverity < 3)) {
      i = (unsigned_long)pcVar2;
      CVar3 = anon_unknown_0::hex(i_00);
      local_40.currentSize = CVar3.currentSize;
      local_40.content._0_4_ = CVar3.content._0_4_;
      local_40.content[4] = CVar3.content[4];
      CVar3 = anon_unknown_0::hex(*(char16_t *)((long)&(result->super_Array<char16_t>).ptr + i * 2))
      ;
      local_50.currentSize = CVar3.currentSize;
      local_50.content._0_4_ = CVar3.content._0_4_;
      local_50.content[4] = CVar3.content[4];
      _::Debug::
      log<char_const(&)[42],unsigned_long&,kj::CappedArray<char,5ul>,kj::CappedArray<char,5ul>>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x32,ERROR,
                 "\"failed: expected \" \"result[i] == expected[i]\", i, hex(result[i]), hex(expected[i])"
                 ,(char (*) [42])"failed: expected result[i] == expected[i]",&i,&local_40,&local_50)
      ;
    }
  }
  return;
}

Assistant:

void expectResImpl(EncodingResult<T> result,
                   ArrayPtr<const U> expected,
                   bool errors = false) {
  if (errors) {
    KJ_EXPECT(result.hadErrors);
  } else {
    KJ_EXPECT(!result.hadErrors);
  }

  KJ_EXPECT(result.size() == expected.size(), result.size(), expected.size());
  for (auto i: kj::zeroTo(kj::min(result.size(), expected.size()))) {
    KJ_EXPECT(result[i] == expected[i], i, hex(result[i]), hex(expected[i]));
  }
}